

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eia608.c
# Opt level: O3

uint16_t eia608_from_utf8_1(utf8_char_t *c,int chan)

{
  uint16_t uVar1;
  ulong uVar2;
  
  uVar1 = _eia608_from_utf8(c);
  if (uVar1 == 0) {
    uVar1 = 0;
  }
  else {
    uVar2 = (ulong)(uVar1 | 0x800);
    if ((uVar1 & 0x6000) != 0) {
      uVar2 = (ulong)uVar1;
    }
    if (chan == 0) {
      uVar2 = (ulong)uVar1;
    }
    uVar1 = CONCAT11(eia608_parity_table[(uint)(uVar2 >> 8) & 0x7f],
                     eia608_parity_table[(uint)uVar2 & 0x7f]);
  }
  return uVar1;
}

Assistant:

uint16_t eia608_from_utf8_1(const utf8_char_t* c, int chan)
{
    uint16_t cc_data = _eia608_from_utf8(c);

    if (0 == cc_data) {
        return cc_data;
    }

    if (chan && !eia608_is_basicna(cc_data)) {
        cc_data |= 0x0800;
    }

    return eia608_parity(cc_data);
}